

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_sizeof_matchState
                 (ZSTD_compressionParameters *cParams,ZSTD_useRowMatchFinderMode_e useRowMatchFinder
                 ,U32 enableDedicatedDictSearch,U32 forCCtx)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  long local_c8;
  size_t local_c0;
  long local_90;
  uint local_88;
  uint local_84;
  long local_80;
  byte local_69;
  size_t slackSpace;
  size_t optSpace;
  size_t lazyAdditionalSpace;
  size_t optPotentialSpace;
  size_t tableSpace;
  size_t h3Size;
  U32 hashLog3;
  size_t hSize;
  size_t chainSize;
  U32 forCCtx_local;
  U32 enableDedicatedDictSearch_local;
  ZSTD_useRowMatchFinderMode_e useRowMatchFinder_local;
  ZSTD_compressionParameters *cParams_local;
  
  local_69 = 0;
  if (enableDedicatedDictSearch != 0) {
    local_69 = forCCtx != 0 ^ 0xff;
  }
  iVar1 = ZSTD_allocateChainTable(cParams->strategy,useRowMatchFinder,(uint)(local_69 & 1));
  if (iVar1 == 0) {
    local_80 = 0;
  }
  else {
    local_80 = 1L << ((byte)cParams->chainLog & 0x3f);
  }
  lVar2 = 1L << ((byte)cParams->hashLog & 0x3f);
  if ((forCCtx == 0) || (cParams->minMatch != 3)) {
    local_88 = 0;
  }
  else {
    if (cParams->windowLog < 0x12) {
      local_84 = cParams->windowLog;
    }
    else {
      local_84 = 0x11;
    }
    local_88 = local_84;
  }
  if (local_88 == 0) {
    local_90 = 0;
  }
  else {
    local_90 = 1L << ((byte)local_88 & 0x3f);
  }
  sVar3 = ZSTD_cwksp_aligned_alloc_size(0xd4);
  sVar4 = ZSTD_cwksp_aligned_alloc_size(0x90);
  sVar5 = ZSTD_cwksp_aligned_alloc_size(0x80);
  sVar6 = ZSTD_cwksp_aligned_alloc_size(0x400);
  sVar7 = ZSTD_cwksp_aligned_alloc_size(0x8008);
  sVar8 = ZSTD_cwksp_aligned_alloc_size(0x1c01c);
  local_c8 = sVar3 + sVar4 + sVar5 + sVar6 + sVar7 + sVar8;
  iVar1 = ZSTD_rowMatchFinderUsed(cParams->strategy,useRowMatchFinder);
  if (iVar1 == 0) {
    local_c0 = 0;
  }
  else {
    local_c0 = ZSTD_cwksp_aligned_alloc_size(lVar2 << 1);
  }
  if ((forCCtx == 0) || (cParams->strategy < ZSTD_btopt)) {
    local_c8 = 0;
  }
  sVar3 = ZSTD_cwksp_slack_space_required();
  return local_80 * 4 + lVar2 * 4 + local_90 * 4 + local_c8 + sVar3 + local_c0;
}

Assistant:

static size_t
ZSTD_sizeof_matchState(const ZSTD_compressionParameters* const cParams,
                       const ZSTD_useRowMatchFinderMode_e useRowMatchFinder,
                       const U32 enableDedicatedDictSearch,
                       const U32 forCCtx)
{
    /* chain table size should be 0 for fast or row-hash strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder, enableDedicatedDictSearch && !forCCtx)
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = (forCCtx && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;
    /* We don't use ZSTD_cwksp_alloc_size() here because the tables aren't
     * surrounded by redzones in ASAN. */
    size_t const tableSpace = chainSize * sizeof(U32)
                            + hSize * sizeof(U32)
                            + h3Size * sizeof(U32);
    size_t const optPotentialSpace =
        ZSTD_cwksp_aligned_alloc_size((MaxML+1) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((MaxLL+1) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((MaxOff+1) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((1<<Litbits) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t))
      + ZSTD_cwksp_aligned_alloc_size((ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    size_t const lazyAdditionalSpace = ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)
                                            ? ZSTD_cwksp_aligned_alloc_size(hSize*sizeof(U16))
                                            : 0;
    size_t const optSpace = (forCCtx && (cParams->strategy >= ZSTD_btopt))
                                ? optPotentialSpace
                                : 0;
    size_t const slackSpace = ZSTD_cwksp_slack_space_required();

    /* tables are guaranteed to be sized in multiples of 64 bytes (or 16 uint32_t) */
    ZSTD_STATIC_ASSERT(ZSTD_HASHLOG_MIN >= 4 && ZSTD_WINDOWLOG_MIN >= 4 && ZSTD_CHAINLOG_MIN >= 4);
    assert(useRowMatchFinder != ZSTD_urm_auto);

    DEBUGLOG(4, "chainSize: %u - hSize: %u - h3Size: %u",
                (U32)chainSize, (U32)hSize, (U32)h3Size);
    return tableSpace + optSpace + slackSpace + lazyAdditionalSpace;
}